

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  byte *pbVar1;
  bool bVar2;
  LogMessage *other;
  undefined7 extraout_var;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  ulong uVar3;
  byte *pbVar4;
  pair<unsigned_long,_bool> pVar5;
  LogFinisher local_51;
  uint64_t temp;
  
  pbVar4 = this->buffer_;
  pbVar1 = this->buffer_end_;
  if (((int)pbVar1 - (int)pbVar4 < 10) && ((pbVar1 <= pbVar4 || ((char)pbVar1[-1] < '\0')))) {
    bVar2 = ReadVarint64Slow(this,&temp);
    uVar3 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  }
  else {
    if (-1 < (char)*pbVar4) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&temp,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1a1);
      other = internal::LogMessage::operator<<
                        ((LogMessage *)&temp,"CHECK failed: (buffer[0]) >= (128): ");
      internal::LogFinisher::operator=(&local_51,other);
      internal::LogMessage::~LogMessage((LogMessage *)&temp);
      in_RDX = extraout_RDX;
    }
    if ((long)(char)pbVar4[1] < 0) {
      if ((char)pbVar4[2] < '\0') {
        if ((char)pbVar4[3] < '\0') {
          if ((char)pbVar4[4] < '\0') {
            if ((char)pbVar4[5] < '\0') {
              if ((char)pbVar4[6] < '\0') {
                if ((char)pbVar4[7] < '\0') {
                  if ((char)pbVar4[8] < '\0') {
                    if ((char)pbVar4[9] < '\0') {
                      temp = 0;
                      uVar3 = 0;
                      goto LAB_00334730;
                    }
                    pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<10ul>(pbVar4,&temp);
                    in_RDX = extraout_RDX_07;
                  }
                  else {
                    pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<9ul>(pbVar4,&temp);
                    in_RDX = extraout_RDX_06;
                  }
                }
                else {
                  pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<8ul>(pbVar4,&temp);
                  in_RDX = extraout_RDX_05;
                }
              }
              else {
                pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<7ul>(pbVar4,&temp);
                in_RDX = extraout_RDX_04;
              }
            }
            else {
              pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<6ul>(pbVar4,&temp);
              in_RDX = extraout_RDX_03;
            }
          }
          else {
            pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<5ul>(pbVar4,&temp);
            in_RDX = extraout_RDX_02;
          }
        }
        else {
          pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<4ul>(pbVar4,&temp);
          in_RDX = extraout_RDX_01;
        }
      }
      else {
        pbVar4 = (anonymous_namespace)::DecodeVarint64KnownSize<3ul>(pbVar4,&temp);
        in_RDX = extraout_RDX_00;
      }
    }
    else {
      temp = ((long)(char)pbVar4[1] * 0x80 + (ulong)*pbVar4) - 0x80;
      pbVar4 = pbVar4 + 2;
    }
    this->buffer_ = pbVar4;
    uVar3 = CONCAT71((int7)((ulong)in_RDX >> 8),1);
  }
LAB_00334730:
  pVar5._8_8_ = uVar3;
  pVar5.first = temp;
  return pVar5;
}

Assistant:

std::pair<uint64_t, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64_t temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}